

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg_parser.cpp
# Opt level: O0

parse_result * __thiscall
ocmesh::details::scene::parse(parse_result *__return_storage_ptr__,scene *this,istream *stream)

{
  parse_result r;
  parser local_c8;
  istream *local_20;
  istream *stream_local;
  scene *this_local;
  
  local_20 = stream;
  stream_local = (istream *)this;
  this_local = (scene *)__return_storage_ptr__;
  parser::parser(&local_c8,this,stream);
  parser::parse(&local_c8);
  parser::~parser(&local_c8);
  memset(__return_storage_ptr__,0,0x28);
  parse_result::parse_result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

scene::parse_result scene::parse(std::istream &stream)
    {
        try {
            parser(this, stream).parse();
        } catch(scene::parse_result r) {
            return r;
        }
        
        return { };
    }